

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkBuildAccelerationStructureFlagsKHR
Diligent::BuildASFlagsToVkBuildAccelerationStructureFlags(RAYTRACING_BUILD_AS_FLAGS Flags)

{
  RAYTRACING_BUILD_AS_FLAGS RVar1;
  string msg;
  uint local_54;
  string local_50;
  
  local_54 = 0;
  do {
    if (Flags == RAYTRACING_BUILD_AS_NONE) {
      return local_54;
    }
    RVar1 = -Flags & Flags;
    Flags = Flags ^ RVar1;
    switch(RVar1) {
    case RAYTRACING_BUILD_AS_ALLOW_UPDATE:
      local_54 = local_54 | 1;
      break;
    case RAYTRACING_BUILD_AS_ALLOW_COMPACTION:
      local_54 = local_54 | 2;
      break;
    case RAYTRACING_BUILD_AS_ALLOW_COMPACTION|RAYTRACING_BUILD_AS_ALLOW_UPDATE:
    case RAYTRACING_BUILD_AS_PREFER_FAST_TRACE|RAYTRACING_BUILD_AS_ALLOW_UPDATE:
    case RAYTRACING_BUILD_AS_PREFER_FAST_TRACE|RAYTRACING_BUILD_AS_ALLOW_COMPACTION:
    case RAYTRACING_BUILD_AS_PREFER_FAST_TRACE|RAYTRACING_BUILD_AS_ALLOW_COMPACTION|
         RAYTRACING_BUILD_AS_ALLOW_UPDATE:
switchD_0025d6a6_caseD_3:
      FormatString<char[22]>(&local_50,(char (*) [22])"unknown build AS flag");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"BuildASFlagsToVkBuildAccelerationStructureFlags",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x6db);
      std::__cxx11::string::~string((string *)&local_50);
      break;
    case RAYTRACING_BUILD_AS_PREFER_FAST_TRACE:
      local_54 = local_54 | 4;
      break;
    case RAYTRACING_BUILD_AS_PREFER_FAST_BUILD:
      local_54 = local_54 | 8;
      break;
    default:
      if (RVar1 != RAYTRACING_BUILD_AS_FLAG_LAST) goto switchD_0025d6a6_caseD_3;
      local_54 = local_54 | 0x10;
    }
  } while( true );
}

Assistant:

VkBuildAccelerationStructureFlagsKHR BuildASFlagsToVkBuildAccelerationStructureFlags(RAYTRACING_BUILD_AS_FLAGS Flags)
{
    static_assert(RAYTRACING_BUILD_AS_FLAG_LAST == RAYTRACING_BUILD_AS_LOW_MEMORY,
                  "Please update the switch below to handle the new ray tracing build flag");

    VkBuildAccelerationStructureFlagsKHR Result = 0;
    while (Flags != RAYTRACING_BUILD_AS_NONE)
    {
        RAYTRACING_BUILD_AS_FLAGS FlagBit = ExtractLSB(Flags);
        switch (FlagBit)
        {
            // clang-format off
            case RAYTRACING_BUILD_AS_ALLOW_UPDATE:      Result |= VK_BUILD_ACCELERATION_STRUCTURE_ALLOW_UPDATE_BIT_KHR;      break;
            case RAYTRACING_BUILD_AS_ALLOW_COMPACTION:  Result |= VK_BUILD_ACCELERATION_STRUCTURE_ALLOW_COMPACTION_BIT_KHR;  break;
            case RAYTRACING_BUILD_AS_PREFER_FAST_TRACE: Result |= VK_BUILD_ACCELERATION_STRUCTURE_PREFER_FAST_TRACE_BIT_KHR; break;
            case RAYTRACING_BUILD_AS_PREFER_FAST_BUILD: Result |= VK_BUILD_ACCELERATION_STRUCTURE_PREFER_FAST_BUILD_BIT_KHR; break;
            case RAYTRACING_BUILD_AS_LOW_MEMORY:        Result |= VK_BUILD_ACCELERATION_STRUCTURE_LOW_MEMORY_BIT_KHR;        break;
            // clang-format on
            default: UNEXPECTED("unknown build AS flag");
        }
    }
    return Result;
}